

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int expand_fast_array(JSContext *ctx,JSObject *p,uint32_t new_len)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  long in_RSI;
  size_t *in_RDI;
  void *unaff_retaddr;
  JSValue *new_array_prop;
  size_t slack;
  uint32_t new_size;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = max_int(in_EDX,(uint)(*(int *)(in_RSI + 0x30) * 3) >> 1);
  pvVar2 = js_realloc2((JSContext *)new_array_prop,unaff_retaddr,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (pvVar2 == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    *(void **)(in_RSI + 0x38) = pvVar2;
    *(int *)(in_RSI + 0x30) = iVar1 + (int)(local_28 >> 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int expand_fast_array(JSContext *ctx, JSObject *p, uint32_t new_len)
{
    uint32_t new_size;
    size_t slack;
    JSValue *new_array_prop;
    /* XXX: potential arithmetic overflow */
    new_size = max_int(new_len, p->u.array.u1.size * 3 / 2);
    new_array_prop = js_realloc2(ctx, p->u.array.u.values, sizeof(JSValue) * new_size, &slack);
    if (!new_array_prop)
        return -1;
    new_size += slack / sizeof(*new_array_prop);
    p->u.array.u.values = new_array_prop;
    p->u.array.u1.size = new_size;
    return 0;
}